

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_shader.cpp
# Opt level: O0

void gen_sketch_shade(float *ca,float *cr,float *cl,float *cp,float *l,float *e,float *norm,float p,
                     float x,float y,float radius,float *line_dir,float *c)

{
  float local_64 [2];
  vec3 cnew;
  vec2 new_line;
  vec2 dot_dir;
  float radius_local;
  float y_local;
  float x_local;
  float p_local;
  float *e_local;
  float *l_local;
  float *cp_local;
  float *cl_local;
  float *cr_local;
  float *ca_local;
  
  gen_lambert_shade(ca,cr,cl,norm,l,c);
  gen_phong_shade(cl,cp,l,e,norm,(int)p,c);
  rgb_to_grayscale(c,c);
  if (0.1 < norm[2]) {
    cnew[1] = *line_dir + 0.1;
    cnew[2] = line_dir[1];
    new_line[0] = x;
    new_line[1] = y;
    vec2_norm(cnew + 1,cnew + 1);
    vec3_scale(local_64,c,1.0);
    vec2_norm(cnew + 1,cnew + 1);
    draw_line(line_dir,radius,new_line,c);
    draw_line(cnew + 1,radius,new_line,local_64);
    if ((local_64[0] == 0.0) && (!NAN(local_64[0]))) {
      vec3_scale(c,c,0.0);
    }
  }
  else {
    vec3_scale(c,c,0.0);
  }
  return;
}

Assistant:

void gen_sketch_shade(const vec3 ca, const vec3 cr, const vec3 cl, const vec3 cp, vec3 l, const vec3 e, const vec3 norm, const float p,
const float x, const float y, const float radius, vec2 line_dir, vec3 c){
    gen_lambert_shade(ca, cr, cl, norm, l, c);
    gen_phong_shade(cl, cp, l, e, norm, p, c);

    //calculate a grayscale output (using luminosity method)
    rgb_to_grayscale(c, c);

    //draw silhouette
    if(norm[2]<=0.1f){
        vec3_scale(c, c, 0.0f);
        return;
    }

    //draw inner sketch with a tilted overline
    vec2 dot_dir = {x, y};
    vec2 new_line = {line_dir[0] + 0.1f, line_dir[1]};
    vec2_norm(new_line, new_line);
    vec3 cnew;
    vec3_scale(cnew, c, 1.0f);
    vec2_norm(new_line, new_line);
    draw_line(line_dir, radius, dot_dir, c);
    draw_line(new_line, radius, dot_dir, cnew);

    //composite
    if(cnew[0]==0.0f) vec3_scale(c, c, 0.0f);
}